

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

int testing::internal::
    CountIf<std::vector<testing::TestPartResult,std::allocator<testing::TestPartResult>>,bool(*)(testing::TestPartResult_const&)>
              (vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_> *c,
              _func_bool_TestPartResult_ptr *predicate)

{
  bool bVar1;
  reference pTVar2;
  __normal_iterator<const_testing::TestPartResult_*,_std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>_>
  local_30;
  __normal_iterator<const_testing::TestPartResult_*,_std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>_>
  local_28;
  const_iterator it;
  int count;
  _func_bool_TestPartResult_ptr *predicate_local;
  vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_> *c_local;
  
  it._M_current._4_4_ = 0;
  local_28._M_current =
       (TestPartResult *)
       std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::begin(c);
  while( true ) {
    local_30._M_current =
         (TestPartResult *)
         std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>::end(c);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::
             __normal_iterator<const_testing::TestPartResult_*,_std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>_>
             ::operator*(&local_28);
    bVar1 = (*predicate)(pTVar2);
    if (bVar1) {
      it._M_current._4_4_ = it._M_current._4_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_testing::TestPartResult_*,_std::vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>_>
    ::operator++(&local_28);
  }
  return it._M_current._4_4_;
}

Assistant:

inline int CountIf(const Container& c, Predicate predicate) {
  // Implemented as an explicit loop since std::count_if() in libCstd on
  // Solaris has a non-standard signature.
  int count = 0;
  for (auto it = c.begin(); it != c.end(); ++it) {
    if (predicate(*it)) ++count;
  }
  return count;
}